

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

void __thiscall re2::Compiler::Setup(Compiler *this,ParseFlags flags,int64 max_mem,Anchor anchor)

{
  ParseFlags PVar1;
  ulong local_30;
  int64 m;
  Anchor anchor_local;
  int64 max_mem_local;
  ParseFlags flags_local;
  Compiler *this_local;
  
  Prog::set_flags(this->prog_,flags);
  PVar1 = operator&(flags,Latin1);
  if (PVar1 != NoParseFlags) {
    this->encoding_ = kEncodingLatin1;
  }
  this->max_mem_ = max_mem;
  if (max_mem < 1) {
    this->max_inst_ = 100000;
  }
  else if (max_mem < 0x1b9) {
    this->max_inst_ = 0;
  }
  else {
    local_30 = max_mem - 0x1b8U >> 3;
    if (0xffffff < local_30) {
      local_30 = 0x1000000;
    }
    if (0xfffffff < local_30) {
      local_30 = 0xfffffff;
    }
    this->max_inst_ = (int)local_30;
  }
  this->anchor_ = anchor;
  return;
}

Assistant:

void Compiler::Setup(Regexp::ParseFlags flags, int64 max_mem,
                     RE2::Anchor anchor) {
  prog_->set_flags(flags);

  if (flags & Regexp::Latin1)
    encoding_ = kEncodingLatin1;
  max_mem_ = max_mem;
  if (max_mem <= 0) {
    max_inst_ = 100000;  // more than enough
  } else if (max_mem <= static_cast<int64>(sizeof(Prog))) {
    // No room for anything.
    max_inst_ = 0;
  } else {
    int64 m = (max_mem - sizeof(Prog)) / sizeof(Prog::Inst);
    // Limit instruction count so that inst->id() fits nicely in an int.
    // SparseArray also assumes that the indices (inst->id()) are ints.
    // The call to WalkExponential uses 2*max_inst_ below,
    // and other places in the code use 2 or 3 * prog->size().
    // Limiting to 2^24 should avoid overflow in those places.
    // (The point of allowing more than 32 bits of memory is to
    // have plenty of room for the DFA states, not to use it up
    // on the program.)
    if (m >= 1<<24)
      m = 1<<24;

    // Inst imposes its own limit (currently bigger than 2^24 but be safe).
    if (m > Prog::Inst::kMaxInst)
      m = Prog::Inst::kMaxInst;

    max_inst_ = static_cast<int>(m);
  }

  anchor_ = anchor;
}